

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3IsReadOnly(Parse *pParse,Table *pTab,int viewOk)

{
  VTable *pVVar1;
  sqlite3 *psVar2;
  char *zFormat;
  uint uVar3;
  VTable **ppVVar4;
  
  if (pTab->nModuleArg == 0) {
    if ((pTab->tabFlags & 0x401) != 0) {
      psVar2 = pParse->db;
      uVar3 = (uint)psVar2->flags;
      if ((pTab->tabFlags & 1) == 0) {
        if (((uVar3 >> 0x1c & 1) != 0) &&
           ((psVar2->pVtabCtx == (VtabCtx *)0x0 && (psVar2->nVdbeExec == 0)))) {
LAB_001b427d:
          zFormat = "table %s may not be modified";
          goto LAB_001b42e0;
        }
      }
      else if (((uVar3 & 0x10000001) != 1) && (pParse->nested == '\0')) goto LAB_001b427d;
    }
  }
  else {
    ppVVar4 = &pTab->pVTable;
    do {
      pVVar1 = *ppVVar4;
      ppVVar4 = &pVVar1->pNext;
    } while (pVVar1->db != pParse->db);
    if (pVVar1->pMod->pModule->xUpdate ==
        (_func_int_sqlite3_vtab_ptr_int_sqlite3_value_ptr_ptr_sqlite3_int64_ptr *)0x0)
    goto LAB_001b427d;
  }
  if (viewOk != 0) {
    return 0;
  }
  if (pTab->pSelect == (Select *)0x0) {
    return 0;
  }
  zFormat = "cannot modify %s because it is a view";
LAB_001b42e0:
  sqlite3ErrorMsg(pParse,zFormat,pTab->zName);
  return 1;
}

Assistant:

SQLITE_PRIVATE int sqlite3IsReadOnly(Parse *pParse, Table *pTab, int viewOk){
  if( tabIsReadOnly(pParse, pTab) ){
    sqlite3ErrorMsg(pParse, "table %s may not be modified", pTab->zName);
    return 1;
  }
#ifndef SQLITE_OMIT_VIEW
  if( !viewOk && pTab->pSelect ){
    sqlite3ErrorMsg(pParse,"cannot modify %s because it is a view",pTab->zName);
    return 1;
  }
#endif
  return 0;
}